

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O2

void print_ordinary(ostream *outstream,int min_dimension,int max_dimension,int top_dimension,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *number_of_cells,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *betti,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> skipped,
                   bool approximate_computation,bool with_cell_counts)

{
  int iVar1;
  int i;
  ostream *poVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t idx;
  long lVar7;
  long lVar8;
  
  if ((char)skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != '\0') {
    poVar2 = std::operator<<(outstream,"# Cell counts (of dimensions between ");
    uVar3 = 1;
    if (1 < min_dimension) {
      uVar3 = (ulong)(uint)min_dimension;
    }
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar3 + -1);
    poVar2 = std::operator<<(poVar2," and ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,top_dimension);
    poVar2 = std::operator<<(poVar2,"):");
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar7 = (long)top_dimension;
    for (lVar8 = uVar3 - 1; lVar8 <= lVar7; lVar8 = lVar8 + 1) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)outstream);
      pcVar6 = "";
      if (lVar8 < lVar7) {
        pcVar6 = " ";
      }
      std::operator<<(poVar2,pcVar6);
    }
    std::endl<char,std::char_traits<char>>(outstream);
    iVar5 = 0;
    for (uVar3 = 0; (long)uVar3 <= lVar7; uVar3 = uVar3 + 1) {
      iVar1 = (int)(number_of_cells->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar3];
      iVar4 = -iVar1;
      if ((uVar3 & 1) == 0) {
        iVar4 = iVar1;
      }
      iVar5 = iVar5 + iVar4;
    }
    if (max_dimension == 0xffff && min_dimension == 0) {
      poVar2 = std::operator<<(outstream,"# Euler characteristic:");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = (ostream *)std::ostream::operator<<(outstream,iVar5);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  if ((char)skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish != '\0') {
    poVar2 = std::operator<<(outstream,
                             "# Skipped columns of the coboundary matrix (in dimensions between ");
    iVar5 = 1;
    if (1 < min_dimension) {
      iVar5 = min_dimension;
    }
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5 - 1U);
    poVar2 = std::operator<<(poVar2," and ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"):");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (uVar3 = (ulong)(iVar5 - 1U);
        uVar3 < (ulong)((long)(skipped.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[1] -
                              *skipped.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3); uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)outstream);
      pcVar6 = "";
      if (uVar3 < (ulong)((long)(betti->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(betti->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 3)) {
        pcVar6 = " ";
      }
      std::operator<<(poVar2,pcVar6);
    }
    std::endl<char,std::char_traits<char>>(outstream);
  }
  poVar2 = std::operator<<(outstream,"# Betti numbers (between ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,min_dimension);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"):");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar3 = (ulong)min_dimension;
      uVar3 < (ulong)((long)(betti->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(betti->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)outstream);
    pcVar6 = "";
    if (uVar3 < (ulong)((long)(betti->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(betti->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3)) {
      pcVar6 = " ";
    }
    std::operator<<(poVar2,pcVar6);
  }
  std::endl<char,std::char_traits<char>>(outstream);
  return;
}

Assistant:

void print_ordinary(std::ostream& outstream, int min_dimension, int max_dimension, int top_dimension,
                    std::vector<size_t> number_of_cells, std::vector<size_t> betti, std::vector<size_t> skipped,
                    bool approximate_computation, bool with_cell_counts) {
	if (with_cell_counts) {
		outstream << "# Cell counts (of dimensions between " << std::max(0, min_dimension - 1) << " and "
		          << top_dimension << "):" << std::endl;
		for (int i = std::max(0, min_dimension - 1); i <= top_dimension; i++)
			outstream << number_of_cells[i] << (i < top_dimension ? " " : "");
		outstream << std::endl;

		index_t cell_euler_characteristic = 0;
		for (int i = 0; i <= top_dimension; i++)
			cell_euler_characteristic += index_t((i % 2 == 1 ? -1 : 1) * number_of_cells[i]);

		bool computed_full_homology = min_dimension == 0 && max_dimension == std::numeric_limits<unsigned short>::max();
		if (computed_full_homology) {
			outstream << "# Euler characteristic:" << std::endl;
			outstream << cell_euler_characteristic << std::endl;
		}
	}

	if (approximate_computation) {
		outstream << "# Skipped columns of the coboundary matrix (in dimensions between "
		          << std::max(0, min_dimension - 1) << " and " << skipped.size() - 1 << "):" << std::endl;
		for (size_t idx = std::max(0, min_dimension - 1); idx < skipped.size(); idx++) {
			outstream << skipped[idx] << (idx < betti.size() ? " " : "");
		}
		outstream << std::endl;
	}

	outstream << "# Betti numbers (between " << min_dimension << " and " << (betti.size() - 1) << "):" << std::endl;
	for (size_t idx = min_dimension; idx < betti.size(); idx++) {
		outstream << betti[idx] << (idx < betti.size() ? " " : "");
	}

	outstream << std::endl;
}